

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svrg.cc
# Opt level: O0

void SVRG::learn(svrg *s,single_learner *base,example *ec)

{
  float value;
  uint32_t uVar1;
  ostream *poVar2;
  example *in_RDX;
  vw *in_RSI;
  example *in_RDI;
  float w;
  svrg *unaff_retaddr;
  uint32_t j;
  int pass;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  uint uVar3;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffe4;
  
  predict((svrg *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
          (single_learner *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
          (example *)0x310d77);
  value = (float)*(undefined8 *)((in_RDI->super_example_predict).indices.end_array + 0x350);
  if ((int)value % (*(int *)&(in_RDI->super_example_predict).indices._begin + 1) == 0) {
    if ((*(float *)((long)&(in_RDI->super_example_predict).indices._begin + 4) != value) &&
       (((in_RDI->super_example_predict).indices.end_array[0x3439] & 1) == 0)) {
      poVar2 = std::operator<<((ostream *)&std::cout,"svrg pass ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)value);
      poVar2 = std::operator<<(poVar2,": committing stable point");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      uVar3 = 0;
      while( true ) {
        uVar4 = uVar3;
        uVar1 = VW::num_weights((vw *)0x310e27);
        if (uVar1 <= uVar3) break;
        VW::get_weight(in_RSI,(uint32_t)((ulong)in_RDX >> 0x20),(uint32_t)in_RDX);
        VW::set_weight(in_RSI,(uint32_t)((ulong)in_RDX >> 0x20),(uint32_t)in_RDX,value);
        VW::set_weight(in_RSI,(uint32_t)((ulong)in_RDX >> 0x20),(uint32_t)in_RDX,value);
        uVar3 = uVar4 + 1;
      }
      *(undefined4 *)&(in_RDI->super_example_predict).indices._end = 0;
      poVar2 = std::operator<<((ostream *)&std::cout,"svrg pass ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)value);
      poVar2 = std::operator<<(poVar2,": computing exact gradient");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    update_stable((svrg *)in_RSI,in_RDX);
    *(int *)&(in_RDI->super_example_predict).indices._end =
         *(int *)&(in_RDI->super_example_predict).indices._end + 1;
  }
  else {
    if ((*(float *)((long)&(in_RDI->super_example_predict).indices._begin + 4) != value) &&
       (((in_RDI->super_example_predict).indices.end_array[0x3439] & 1) == 0)) {
      poVar2 = std::operator<<((ostream *)&std::cout,"svrg pass ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)value);
      poVar2 = std::operator<<(poVar2,": taking steps");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    update_inner(unaff_retaddr,in_RDI);
  }
  *(float *)((long)&(in_RDI->super_example_predict).indices._begin + 4) = value;
  return;
}

Assistant:

void learn(svrg& s, single_learner& base, example& ec)
{
  assert(ec.in_use);

  predict(s, base, ec);

  const int pass = (int)s.all->passes_complete;

  if (pass % (s.stage_size + 1) == 0)  // Compute exact gradient
  {
    if (s.prev_pass != pass && !s.all->quiet)
    {
      cout << "svrg pass " << pass << ": committing stable point" << endl;
      for (uint32_t j = 0; j < VW::num_weights(*s.all); j++)
      {
        float w = VW::get_weight(*s.all, j, W_INNER);
        VW::set_weight(*s.all, j, W_STABLE, w);
        VW::set_weight(*s.all, j, W_STABLEGRAD, 0.f);
      }
      s.stable_grad_count = 0;
      cout << "svrg pass " << pass << ": computing exact gradient" << endl;
    }
    update_stable(s, ec);
    s.stable_grad_count++;
  }
  else  // Perform updates
  {
    if (s.prev_pass != pass && !s.all->quiet)
    {
      cout << "svrg pass " << pass << ": taking steps" << endl;
    }
    update_inner(s, ec);
  }

  s.prev_pass = pass;
}